

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O2

void res_load_63(ResourceData *pResData,char *path,char *name,UErrorCode *errorCode)

{
  UDataMemory *pData;
  void *inBytes;
  UVersionInfo formatVersion;
  
  pResData->poolStringIndexLimit = 0;
  pResData->poolStringIndex16Limit = 0;
  pResData->noFallback = '\0';
  pResData->isPoolBundle = '\0';
  pResData->usesPoolBundle = '\0';
  pResData->useNativeStrcmp = '\0';
  *(undefined4 *)&pResData->field_0x3c = 0;
  pResData->rootRes = 0;
  pResData->localKeyLimit = 0;
  pResData->poolBundleStrings = (uint16_t *)0x0;
  pResData->p16BitUnits = (uint16_t *)0x0;
  pResData->poolBundleKeys = (char *)0x0;
  pResData->data = (UDataMemory *)0x0;
  pResData->pRoot = (int32_t *)0x0;
  pData = udata_openChoice_63(path,"res",name,isAcceptable,formatVersion,errorCode);
  pResData->data = pData;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    inBytes = udata_getMemory_63(pData);
    res_init(pResData,formatVersion,inBytes,-1,errorCode);
  }
  return;
}

Assistant:

U_CFUNC void
res_load(ResourceData *pResData,
         const char *path, const char *name, UErrorCode *errorCode) {
    UVersionInfo formatVersion;

    uprv_memset(pResData, 0, sizeof(ResourceData));

    /* load the ResourceBundle file */
    pResData->data=udata_openChoice(path, "res", name, isAcceptable, formatVersion, errorCode);
    if(U_FAILURE(*errorCode)) {
        return;
    }

    /* get its memory and initialize *pResData */
    res_init(pResData, formatVersion, udata_getMemory(pResData->data), -1, errorCode);
}